

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O0

LY_ERR lydjson_metadata(lyd_json_ctx *lydctx,lysc_node *snode,lyd_node *node)

{
  ly_ctx *ctx_00;
  char *pcVar1;
  LYJSON_PARSER_STATUS LVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  ly_bool *is_meta_p;
  undefined4 uVar6;
  lysc_node *local_f8;
  lysc_node *local_f0;
  lysc_node *local_e8;
  size_t local_c8;
  size_t module_name_len;
  char *module_name;
  uint32_t local_b0;
  uint uStack_ac;
  uint16_t nodetype;
  uint32_t val_hints;
  uint32_t instance;
  lyd_node *prev;
  ly_ctx *plStack_98;
  ly_bool is_attr;
  ly_ctx *ctx;
  lys_module *mod;
  size_t prefix_len;
  size_t name_len;
  char *dynamic_prefname;
  char *prefix;
  char *name;
  char *pcStack_58;
  ly_bool in_parent;
  char *expected;
  LYJSON_PARSER_STATUS local_48;
  LYJSON_PARSER_STATUS status;
  LY_ERR r;
  LY_ERR rc;
  lyd_node *node_local;
  lysc_node *snode_local;
  lyd_json_ctx *lydctx_local;
  
  status = LYJSON_ERROR;
  name._7_1_ = '\0';
  dynamic_prefname = (char *)0x0;
  name_len = 0;
  mod = (lys_module *)0x0;
  plStack_98 = lydctx->jsonctx->ctx;
  prev._7_1_ = '\0';
  uStack_ac = 0;
  _val_hints = node;
  _r = node;
  node_local = (lyd_node *)snode;
  snode_local = (lysc_node *)lydctx;
  if ((snode == (lysc_node *)0x0) && (node == (lyd_node *)0x0)) {
    __assert_fail("snode || node",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x2e6,
                  "LY_ERR lydjson_metadata(struct lyd_json_ctx *, const struct lysc_node *, struct lyd_node *)"
                 );
  }
  if (snode == (lysc_node *)0x0) {
    module_name._6_2_ = 1;
  }
  else {
    module_name._6_2_ = snode->nodetype;
    ly_log_location(snode,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
  }
  status = lyjson_ctx_next((lyjson_ctx *)snode_local[0x34].ref,
                           (LYJSON_PARSER_STATUS *)((long)&expected + 4));
  if (status != LYJSON_ERROR) goto LAB_00150e7f;
  LVar2 = LYJSON_ERROR;
  if (module_name._6_2_ == 1) {
LAB_0015081c:
    name._7_1_ = '\x01';
    pcStack_58 = "@/object";
joined_r0x00150813:
    if (expected._4_4_ == LYJSON_OBJECT) goto LAB_0015086d;
  }
  else {
    if (module_name._6_2_ == 4) {
LAB_00150804:
      pcStack_58 = "@name/object";
      goto joined_r0x00150813;
    }
    if (module_name._6_2_ != 8) {
      if (module_name._6_2_ != 0x10) {
        if (module_name._6_2_ == 0x20) goto LAB_00150804;
        if ((((module_name._6_2_ != 0x60) && (module_name._6_2_ != 0x100)) &&
            (module_name._6_2_ != 0x200)) && (module_name._6_2_ != 0x400)) {
          ly_log(plStack_98,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                 ,0x322);
          status = LYJSON_ARRAY_CLOSED;
          goto LAB_00150e7f;
        }
      }
      goto LAB_0015081c;
    }
    pcStack_58 = "@name/array of objects/nulls";
    if (expected._4_4_ == LYJSON_ARRAY) {
      do {
        while( true ) {
          if ((expected._4_4_ == LYJSON_ARRAY_CLOSED) ||
             (status = lyjson_ctx_next((lyjson_ctx *)snode_local[0x34].ref,
                                       (LYJSON_PARSER_STATUS *)((long)&expected + 4)),
             status != LYJSON_ERROR)) goto LAB_00150e7f;
          uStack_ac = uStack_ac + 1;
          if ((expected._4_4_ != LYJSON_OBJECT) && (expected._4_4_ != LYJSON_NULL)) {
            LVar2 = LYJSON_ERROR;
            goto LAB_00150d4d;
          }
          if ((_r == (lyd_node *)0x0) || (_r->schema != _val_hints->schema)) {
            ly_vlog(*(ly_ctx **)snode_local[0x34].ref,(char *)0x0,LYVE_REFERENCE,
                    "Missing JSON data instance #%u of %s:%s to be coupled with metadata.",
                    (ulong)uStack_ac,_val_hints->schema->module->name,_val_hints->schema->name);
            status = LYJSON_OBJECT_NAME;
            goto LAB_00150e7f;
          }
          if (expected._4_4_ != LYJSON_NULL) break;
          _val_hints = _r;
          _r = _r->next;
          status = lyjson_ctx_next((lyjson_ctx *)snode_local[0x34].ref,
                                   (LYJSON_PARSER_STATUS *)((long)&expected + 4));
          if (status != LYJSON_ERROR) goto LAB_00150e7f;
        }
LAB_0015086d:
        status = LYJSON_ERROR;
        if (expected._4_4_ != LYJSON_OBJECT) {
          __assert_fail("status == LYJSON_OBJECT",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                        ,0x328,
                        "LY_ERR lydjson_metadata(struct lyd_json_ctx *, const struct lysc_node *, struct lyd_node *)"
                       );
        }
        do {
          status = lyjson_ctx_next((lyjson_ctx *)snode_local[0x34].ref,
                                   (LYJSON_PARSER_STATUS *)((long)&expected + 4));
          if (status != LYJSON_ERROR) goto LAB_00150e7f;
          if (expected._4_4_ != LYJSON_OBJECT_NAME) {
            LVar2 = LYJSON_ERROR;
            goto LAB_00150d4d;
          }
          is_meta_p = (ly_bool *)((long)&prev + 7);
          lydjson_parse_name(*(char **)(snode_local[0x34].ref + 0x20),
                             *(size_t *)(snode_local[0x34].ref + 0x28),&prefix,&prefix_len,
                             &dynamic_prefname,(size_t *)&mod,is_meta_p);
          uVar6 = (undefined4)((ulong)is_meta_p >> 0x20);
          lyjson_ctx_give_dynamic_value((lyjson_ctx *)snode_local[0x34].ref,(char **)&name_len);
          if (prefix_len == 0) {
            ly_vlog(plStack_98,(char *)0x0,LYVE_SYNTAX_JSON,
                    "Metadata in JSON found with an empty name, followed by: %.10s",prefix);
            status = LYJSON_OBJECT_NAME;
            goto LAB_00150e7f;
          }
          if (mod == (lys_module *)0x0) {
            ly_vlog(plStack_98,(char *)0x0,LYVE_SYNTAX_JSON,
                    "Metadata in JSON must be namespace-qualified, missing prefix for \"%.*s\".",
                    *(ulong *)(snode_local[0x34].ref + 0x28) & 0xffffffff,
                    *(undefined8 *)(snode_local[0x34].ref + 0x20));
            status = LYJSON_OBJECT_NAME;
            goto LAB_00150e7f;
          }
          if (prev._7_1_ != '\0') {
            ly_vlog(plStack_98,(char *)0x0,LYVE_SYNTAX_JSON,
                    "Invalid format of the Metadata identifier in JSON, unexpected \'@\' in \"%.*s\""
                    ,*(ulong *)(snode_local[0x34].ref + 0x28) & 0xffffffff,
                    *(undefined8 *)(snode_local[0x34].ref + 0x20));
            status = LYJSON_OBJECT_NAME;
            goto LAB_00150e7f;
          }
          ctx = (ly_ctx *)ly_ctx_get_module_implemented2(plStack_98,dynamic_prefname,(size_t)mod);
          if (ctx == (ly_ctx *)0x0) {
            if (((ulong)snode_local->module & 0x20000) != 0) {
              ly_vlog(plStack_98,(char *)0x0,LYVE_REFERENCE,
                      "Prefix \"%.*s\" of the metadata \"%.*s\" does not match any module in the context."
                      ,(ulong)mod & 0xffffffff,dynamic_prefname,CONCAT44(uVar6,(int)prefix_len),
                      prefix);
              status = LYJSON_OBJECT_NAME;
              goto LAB_00150e7f;
            }
            if (_r->schema == (lysc_node *)0x0) {
              if (((ulong)snode_local->module & 0x40000) == 0) {
                __assert_fail("lydctx->parse_opts & LYD_PARSE_OPAQ",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                              ,0x350,
                              "LY_ERR lydjson_metadata(struct lyd_json_ctx *, const struct lysc_node *, struct lyd_node *)"
                             );
              }
              goto LAB_00150aea;
            }
            status = lydjson_data_skip((lyjson_ctx *)snode_local[0x34].ref);
            if (status != LYJSON_ERROR) goto LAB_00150e7f;
            expected._4_4_ = lyjson_ctx_status((lyjson_ctx *)snode_local[0x34].ref);
          }
          else {
LAB_00150aea:
            status = lyjson_ctx_next((lyjson_ctx *)snode_local[0x34].ref,
                                     (LYJSON_PARSER_STATUS *)((long)&expected + 4));
            if ((status != LYJSON_ERROR) ||
               (status = lydjson_value_type_hint
                                   ((lyjson_ctx *)snode_local[0x34].ref,
                                    (LYJSON_PARSER_STATUS *)((long)&expected + 4),&local_b0),
               status != LYJSON_ERROR)) goto LAB_00150e7f;
            if (_r->schema == (lysc_node *)0x0) {
              lydjson_get_node_prefix
                        (_r,dynamic_prefname,(size_t)mod,(char **)&module_name_len,&local_c8);
              status = lyd_create_attr(_r,(lyd_attr **)0x0,*(ly_ctx **)snode_local[0x34].ref,prefix,
                                       prefix_len,dynamic_prefname,(size_t)mod,
                                       (char *)module_name_len,local_c8,
                                       *(char **)(snode_local[0x34].ref + 0x20),
                                       *(size_t *)(snode_local[0x34].ref + 0x28),
                                       (ly_bool *)(snode_local[0x34].ref + 0x30),LY_VALUE_JSON,
                                       (void *)0x0,local_b0);
            }
            else {
              status = lyd_parser_create_meta
                                 ((lyd_ctx *)snode_local,_r,(lyd_meta **)0x0,(lys_module *)ctx,
                                  prefix,prefix_len,*(void **)(snode_local[0x34].ref + 0x20),
                                  *(size_t *)(snode_local[0x34].ref + 0x28),
                                  (ly_bool *)(snode_local[0x34].ref + 0x30),LY_VALUE_JSON,
                                  (void *)0x0,local_b0,_r->schema);
              if (status != LYJSON_ERROR) goto LAB_00150e7f;
              status = lyd_parser_set_data_flags
                                 (_r,&_r->meta,(lyd_ctx *)snode_local,(lysc_ext_instance *)0x0);
            }
            if (status != LYJSON_ERROR) goto LAB_00150e7f;
            status = LYJSON_ERROR;
            status = lyjson_ctx_next((lyjson_ctx *)snode_local[0x34].ref,
                                     (LYJSON_PARSER_STATUS *)((long)&expected + 4));
            if (status != LYJSON_ERROR) goto LAB_00150e7f;
          }
        } while (expected._4_4_ == LYJSON_OBJECT_NEXT);
        LVar2 = status;
        if (expected._4_4_ != LYJSON_OBJECT_CLOSED) goto LAB_00150d4d;
        if (module_name._6_2_ != 8) break;
        _val_hints = _r;
        _r = _r->next;
        status = lyjson_ctx_next((lyjson_ctx *)snode_local[0x34].ref,
                                 (LYJSON_PARSER_STATUS *)((long)&expected + 4));
      } while (status == LYJSON_ERROR);
      goto LAB_00150e7f;
    }
  }
LAB_00150d4d:
  status = LVar2;
  ctx_00 = plStack_98;
  pcVar3 = lys_nodetype2str(module_name._6_2_);
  pcVar1 = pcStack_58;
  if (_r == (lyd_node *)0x0) {
    if (_val_hints->schema == (lysc_node *)0x0) {
      local_f8 = _val_hints[1].schema;
    }
    else {
      local_f8 = (lysc_node *)_val_hints->schema->name;
    }
    local_f0 = local_f8;
  }
  else {
    if (_r->schema == (lysc_node *)0x0) {
      local_e8 = _r[1].schema;
    }
    else {
      local_e8 = (lysc_node *)_r->schema->name;
    }
    local_f0 = local_e8;
  }
  pcVar4 = lyjson_token2str(expected._4_4_);
  pcVar5 = "name";
  if (name._7_1_ != '\0') {
    pcVar5 = "";
  }
  ly_vlog(ctx_00,(char *)0x0,LYVE_SYNTAX_JSON,
          "The attribute(s) of %s \"%s\" is expected to be represented as JSON %s, but input data contains @%s/%s."
          ,pcVar3,local_f0,pcVar1,pcVar4,pcVar5);
  status = LYJSON_OBJECT_NAME;
LAB_00150e7f:
  if (((status == LYJSON_OBJECT_NAME) && (((ulong)snode_local->module & 0x400000000) != 0)) &&
     (local_48 = lydjson_data_skip((lyjson_ctx *)snode_local[0x34].ref), local_48 != LYJSON_ERROR))
  {
    status = local_48;
  }
  free((void *)name_len);
  ly_log_location_revert((uint)(node_local != (lyd_node *)0x0),0,0,0);
  return status;
}

Assistant:

static LY_ERR
lydjson_metadata(struct lyd_json_ctx *lydctx, const struct lysc_node *snode, struct lyd_node *node)
{
    LY_ERR rc = LY_SUCCESS, r;
    enum LYJSON_PARSER_STATUS status;
    const char *expected;
    ly_bool in_parent = 0;
    const char *name, *prefix = NULL;
    char *dynamic_prefname = NULL;
    size_t name_len, prefix_len = 0;
    struct lys_module *mod;
    const struct ly_ctx *ctx = lydctx->jsonctx->ctx;
    ly_bool is_attr = 0;
    struct lyd_node *prev = node;
    uint32_t instance = 0, val_hints;
    uint16_t nodetype;

    assert(snode || node);

    nodetype = snode ? snode->nodetype : LYS_CONTAINER;
    if (snode) {
        LOG_LOCSET(snode, NULL);
    }

    /* move to the second item in the name/X pair */
    LY_CHECK_GOTO(rc = lyjson_ctx_next(lydctx->jsonctx, &status), cleanup);

    /* check attribute encoding */
    switch (nodetype) {
    case LYS_LEAFLIST:
        expected = "@name/array of objects/nulls";
        LY_CHECK_GOTO(status != LYJSON_ARRAY, representation_error);

next_entry:
        if (status == LYJSON_ARRAY_CLOSED) {
            /* no more metadata */
            goto cleanup;
        }

        /* move into the array/next item */
        LY_CHECK_GOTO(rc = lyjson_ctx_next(lydctx->jsonctx, &status), cleanup);
        instance++;
        LY_CHECK_GOTO((status != LYJSON_OBJECT) && (status != LYJSON_NULL), representation_error);

        if (!node || (node->schema != prev->schema)) {
            LOGVAL(lydctx->jsonctx->ctx, LYVE_REFERENCE, "Missing JSON data instance #%" PRIu32
                    " of %s:%s to be coupled with metadata.", instance, prev->schema->module->name, prev->schema->name);
            rc = LY_EVALID;
            goto cleanup;
        }

        if (status == LYJSON_NULL) {
            /* continue with the next entry in the leaf-list array */
            prev = node;
            node = node->next;

            LY_CHECK_GOTO(rc = lyjson_ctx_next(lydctx->jsonctx, &status), cleanup);
            goto next_entry;
        }
        break;
    case LYS_LEAF:
    case LYS_ANYXML:
        expected = "@name/object";

        LY_CHECK_GOTO(status != LYJSON_OBJECT, representation_error);
        break;
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_ANYDATA:
    case LYS_NOTIF:
    case LYS_ACTION:
    case LYS_RPC:
        in_parent = 1;
        expected = "@/object";
        LY_CHECK_GOTO(status != LYJSON_OBJECT, representation_error);
        break;
    default:
        LOGINT(ctx);
        rc = LY_EINT;
        goto cleanup;
    }

    /* process all the members inside a single metadata object */
    assert(status == LYJSON_OBJECT);
    do {
        LY_CHECK_GOTO(rc = lyjson_ctx_next(lydctx->jsonctx, &status), cleanup);
        LY_CHECK_GOTO(status != LYJSON_OBJECT_NAME, representation_error);

        lydjson_parse_name(lydctx->jsonctx->value, lydctx->jsonctx->value_len, &name, &name_len, &prefix, &prefix_len, &is_attr);
        lyjson_ctx_give_dynamic_value(lydctx->jsonctx, &dynamic_prefname);

        if (!name_len) {
            LOGVAL(ctx, LYVE_SYNTAX_JSON, "Metadata in JSON found with an empty name, followed by: %.10s", name);
            rc = LY_EVALID;
            goto cleanup;
        } else if (!prefix_len) {
            LOGVAL(ctx, LYVE_SYNTAX_JSON, "Metadata in JSON must be namespace-qualified, missing prefix for \"%.*s\".",
                    (int)lydctx->jsonctx->value_len, lydctx->jsonctx->value);
            rc = LY_EVALID;
            goto cleanup;
        } else if (is_attr) {
            LOGVAL(ctx, LYVE_SYNTAX_JSON, "Invalid format of the Metadata identifier in JSON, unexpected '@' in \"%.*s\"",
                    (int)lydctx->jsonctx->value_len, lydctx->jsonctx->value);
            rc = LY_EVALID;
            goto cleanup;
        }

        /* get the element module */
        mod = ly_ctx_get_module_implemented2(ctx, prefix, prefix_len);
        if (!mod) {
            if (lydctx->parse_opts & LYD_PARSE_STRICT) {
                LOGVAL(ctx, LYVE_REFERENCE, "Prefix \"%.*s\" of the metadata \"%.*s\" does not match any module in the context.",
                        (int)prefix_len, prefix, (int)name_len, name);
                rc = LY_EVALID;
                goto cleanup;
            }
            if (node->schema) {
                /* skip element with children */
                LY_CHECK_GOTO(rc = lydjson_data_skip(lydctx->jsonctx), cleanup);
                status = lyjson_ctx_status(lydctx->jsonctx);
                /* end of the item */
                continue;
            }
            assert(lydctx->parse_opts & LYD_PARSE_OPAQ);
        }

        /* get the value */
        LY_CHECK_GOTO(rc = lyjson_ctx_next(lydctx->jsonctx, &status), cleanup);

        /* get value hints */
        LY_CHECK_GOTO(rc = lydjson_value_type_hint(lydctx->jsonctx, &status, &val_hints), cleanup);

        if (node->schema) {
            /* create metadata */
            rc = lyd_parser_create_meta((struct lyd_ctx *)lydctx, node, NULL, mod, name, name_len, lydctx->jsonctx->value,
                    lydctx->jsonctx->value_len, &lydctx->jsonctx->dynamic, LY_VALUE_JSON, NULL, val_hints, node->schema);
            LY_CHECK_GOTO(rc, cleanup);

            /* add/correct flags */
            rc = lyd_parser_set_data_flags(node, &node->meta, (struct lyd_ctx *)lydctx, NULL);
            LY_CHECK_GOTO(rc, cleanup);
        } else {
            /* create attribute */
            const char *module_name;
            size_t module_name_len;

            lydjson_get_node_prefix(node, prefix, prefix_len, &module_name, &module_name_len);

            /* attr2 is always changed to the created attribute */
            rc = lyd_create_attr(node, NULL, lydctx->jsonctx->ctx, name, name_len, prefix, prefix_len, module_name,
                    module_name_len, lydctx->jsonctx->value, lydctx->jsonctx->value_len, &lydctx->jsonctx->dynamic,
                    LY_VALUE_JSON, NULL, val_hints);
            LY_CHECK_GOTO(rc, cleanup);
        }

        /* next member */
        LY_CHECK_GOTO(rc = lyjson_ctx_next(lydctx->jsonctx, &status), cleanup);
    } while (status == LYJSON_OBJECT_NEXT);
    LY_CHECK_GOTO(status != LYJSON_OBJECT_CLOSED, representation_error);

    if (nodetype == LYS_LEAFLIST) {
        /* continue by processing another metadata object for the following
         * leaf-list instance since they are always instantiated in JSON array */
        prev = node;
        node = node->next;

        LY_CHECK_GOTO(rc = lyjson_ctx_next(lydctx->jsonctx, &status), cleanup);
        goto next_entry;
    }

    /* success */
    goto cleanup;

representation_error:
    LOGVAL(ctx, LYVE_SYNTAX_JSON,
            "The attribute(s) of %s \"%s\" is expected to be represented as JSON %s, but input data contains @%s/%s.",
            lys_nodetype2str(nodetype), node ? LYD_NAME(node) : LYD_NAME(prev), expected, lyjson_token2str(status),
            in_parent ? "" : "name");
    rc = LY_EVALID;

cleanup:
    if ((rc == LY_EVALID) && (lydctx->val_opts & LYD_VALIDATE_MULTI_ERROR)) {
        /* try to skip the invalid data */
        if ((r = lydjson_data_skip(lydctx->jsonctx))) {
            rc = r;
        }
    }
    free(dynamic_prefname);
    LOG_LOCBACK(snode ? 1 : 0, 0);
    return rc;
}